

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

xmlSchematronValidCtxtPtr xmlSchematronNewValidCtxt(xmlSchematronPtr schema,int options)

{
  xmlChar *ns_uri;
  xmlChar *prefix;
  xmlSchematronValidCtxtPtr ctxt;
  xmlXPathContextPtr pxVar1;
  long lVar2;
  long lVar3;
  
  ctxt = (xmlSchematronValidCtxtPtr)(*xmlMalloc)(0x70);
  if (ctxt == (xmlSchematronValidCtxtPtr)0x0) {
    ctxt = (xmlSchematronValidCtxtPtr)0x0;
    __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,"allocating validation context");
  }
  else {
    ctxt->type = 0;
    ctxt->flags = 0;
    ctxt->dict = (xmlDictPtr)0x0;
    ctxt->nberrors = 0;
    ctxt->err = 0;
    ctxt->schema = (xmlSchematronPtr)0x0;
    ctxt->warning = (xmlSchematronValidityWarningFunc)0x0;
    ctxt->serror = (xmlStructuredErrorFunc)0x0;
    ctxt->userData = (void *)0x0;
    ctxt->error = (xmlSchematronValidityErrorFunc)0x0;
    ctxt->ioclose = (xmlOutputCloseCallback)0x0;
    ctxt->ioctx = (void *)0x0;
    ctxt->outputBuffer = (xmlBufferPtr)0x0;
    ctxt->iowrite = (xmlOutputWriteCallback)0x0;
    ctxt->xctxt = (xmlXPathContextPtr)0x0;
    ctxt->outputFile = (FILE *)0x0;
    ctxt->type = 2;
    ctxt->schema = schema;
    pxVar1 = xmlXPathNewContext((xmlDocPtr)0x0);
    ctxt->xctxt = pxVar1;
    ctxt->flags = options;
    if (pxVar1 == (xmlXPathContextPtr)0x0) {
      __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating schema parser XPath context");
      xmlSchematronFreeValidCtxt(ctxt);
      ctxt = (xmlSchematronValidCtxtPtr)0x0;
    }
    else if (0 < schema->nbNamespaces) {
      lVar3 = 8;
      lVar2 = 0;
      do {
        ns_uri = *(xmlChar **)((long)schema->namespaces + lVar3 + -8);
        if (ns_uri == (xmlChar *)0x0) {
          return ctxt;
        }
        prefix = *(xmlChar **)((long)schema->namespaces + lVar3);
        if (prefix == (xmlChar *)0x0) {
          return ctxt;
        }
        xmlXPathRegisterNs(ctxt->xctxt,prefix,ns_uri);
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar2 < schema->nbNamespaces);
    }
  }
  return ctxt;
}

Assistant:

xmlSchematronValidCtxtPtr
xmlSchematronNewValidCtxt(xmlSchematronPtr schema, int options)
{
    int i;
    xmlSchematronValidCtxtPtr ret;

    ret = (xmlSchematronValidCtxtPtr) xmlMalloc(sizeof(xmlSchematronValidCtxt));
    if (ret == NULL) {
        xmlSchematronVErrMemory(NULL, "allocating validation context",
                                NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronValidCtxt));
    ret->type = XML_STRON_CTXT_VALIDATOR;
    ret->schema = schema;
    ret->xctxt = xmlXPathNewContext(NULL);
    ret->flags = options;
    if (ret->xctxt == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser XPath context",
                                NULL);
	xmlSchematronFreeValidCtxt(ret);
        return (NULL);
    }
    for (i = 0;i < schema->nbNamespaces;i++) {
        if ((schema->namespaces[2 * i] == NULL) ||
            (schema->namespaces[2 * i + 1] == NULL))
	    break;
	xmlXPathRegisterNs(ret->xctxt, schema->namespaces[2 * i + 1],
	                   schema->namespaces[2 * i]);
    }
    return (ret);
}